

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O3

void sx_iff_init_from_file_writer_cold_2(void)

{
  code *pcVar1;
  
  sx__mem_run_fail_callback
            ("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/include/sx/array.h",0x6d
            );
  sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/include/sx/array.h"
                    ,0x6d,"Out of memory");
  pcVar1 = (code *)swi(3);
  (*pcVar1)();
  return;
}

Assistant:

void sx_mem_init_block_ptr(sx_mem_block* mem, void* data, int64_t size)
{
    mem->alloc = NULL;
    mem->data = data;
    mem->size = size;
    mem->start_offset = 0;
    mem->align = 0;
    mem->refcount = 1;
}